

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O0

void __thiscall
vkt::pipeline::ColorFragmentShader::ColorFragmentShader
          (ColorFragmentShader *this,TextureFormat *colorFormat,TextureFormat *depthStencilFormat)

{
  TextureChannelClass TVar1;
  reference pvVar2;
  reference pvVar3;
  GenericVecType local_44;
  TextureChannelClass channelClass;
  TextureFormat *depthStencilFormat_local;
  TextureFormat *colorFormat_local;
  ColorFragmentShader *this_local;
  
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,2,1);
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_016a3800;
  this->m_colorFormat = *colorFormat;
  this->m_depthStencilFormat = *depthStencilFormat;
  TVar1 = tcu::getTextureChannelClass((this->m_colorFormat).type);
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,0);
  pvVar2->type = GENERICVECTYPE_FLOAT;
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,1);
  pvVar2->type = GENERICVECTYPE_FLOAT;
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_44 = GENERICVECTYPE_INT32;
  }
  else {
    local_44 = (GenericVecType)(TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
  }
  pvVar3 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_outputs,0);
  pvVar3->type = local_44;
  return;
}

Assistant:

ColorFragmentShader (const tcu::TextureFormat& colorFormat,
						 const tcu::TextureFormat& depthStencilFormat)
		: rr::FragmentShader	(2, 1)
		, m_colorFormat			(colorFormat)
		, m_depthStencilFormat	(depthStencilFormat)
	{
		const tcu::TextureChannelClass channelClass = tcu::getTextureChannelClass(m_colorFormat.type);

		m_inputs[0].type	= rr::GENERICVECTYPE_FLOAT;
		m_inputs[1].type	= rr::GENERICVECTYPE_FLOAT;
		m_outputs[0].type	= (channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)? rr::GENERICVECTYPE_INT32 :
							  (channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)? rr::GENERICVECTYPE_UINT32
							  : rr::GENERICVECTYPE_FLOAT;
	}